

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17898ce::BlendA64Mask1DTestHBD_RandomValues_Test::TestBody
          (BlendA64Mask1DTestHBD_RandomValues_Test *this)

{
  ACMRandom *this_00;
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  int bsize;
  int block_size;
  
  this_00 = &(this->super_BlendA64Mask1DTestHBD).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
             .rng_;
  for (iVar2 = 8; (this->super_BlendA64Mask1DTestHBD).bit_depth_ = iVar2, iVar2 < 0xd;
      iVar2 = iVar2 + 2) {
    for (block_size = 0; iVar2 = (this->super_BlendA64Mask1DTestHBD).bit_depth_, block_size != 0x16;
        block_size = block_size + 1) {
      uVar3 = 1 << ((byte)iVar2 & 0x1f);
      for (lVar4 = 0x3c024; lVar4 != 0x50024; lVar4 = lVar4 + 1) {
        uVar1 = testing::internal::Random::Generate(&this_00->random_,uVar3);
        *(short *)((long)this + lVar4 * 2 + -0x78010) = (short)uVar1;
        uVar1 = testing::internal::Random::Generate(&this_00->random_,uVar3);
        *(short *)((long)this + lVar4 * 2 + -0x50010) = (short)uVar1;
        uVar1 = testing::internal::Random::Generate(&this_00->random_,uVar3);
        *(short *)((long)this + lVar4 * 2 + -0x28008) = (short)uVar1;
        uVar1 = testing::internal::Random::Generate(&this_00->random_,uVar3);
        (this->super_BlendA64Mask1DTestHBD).
        super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
        .dst_ref_[lVar4 + -0x1c] = (unsigned_short)uVar1;
      }
      for (lVar4 = 0xa0050; lVar4 != 0xa0150; lVar4 = lVar4 + 1) {
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x41);
        *(char *)((long)(this->super_BlendA64Mask1DTestHBD).
                        super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                        .dst_ref_ + lVar4 + -0x38) = (char)uVar3;
      }
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                *)this,block_size);
    }
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, RandomValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      const int hi = 1 << bit_depth_;

      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_(hi);
        dst_tst_[i] = rng_(hi);
        src0_[i] = rng_(hi);
        src1_[i] = rng_(hi);
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      Common(bsize);
    }
  }
}